

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O2

filetime_t FileSystemUtils::GetCurrentTime(void)

{
  filetime_t timer;
  filetime_t local_10;
  
  time(&local_10);
  return local_10;
}

Assistant:

inline filetime_t GetCurrentTime()
    {
        filetime_t timer;
#ifdef _WIN32
        _time64(&timer);
#else
        time(&timer);
#endif
        return timer;
    }